

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_alpha.cpp
# Opt level: O0

void __thiscall QAlphaPaintEngine::flushAndInit(QAlphaPaintEngine *this,bool init)

{
  QBrush *pQVar1;
  QFont *pQVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QAlphaPaintEnginePrivate *pQVar9;
  QRegion *pQVar10;
  QTransform *pQVar11;
  QAlphaPaintEnginePrivate *pQVar12;
  QPoint *p;
  QPicturePrivate *pQVar13;
  QPainter *this_00;
  QPaintEngine *pQVar14;
  type pQVar15;
  byte in_SIL;
  long in_RDI;
  long in_FS_OFFSET;
  double dVar16;
  QPainter *oldPainter;
  QPainterState *state;
  QRect *rect;
  const_iterator __end2;
  const_iterator __begin2;
  QRegion *__range2;
  QAlphaPaintEnginePrivate *d;
  QRegion oldAlphaRegion;
  QRect br;
  QTransform mtx;
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  QRegion *in_stack_fffffffffffffe10;
  QFlag QVar17;
  QRect *in_stack_fffffffffffffe18;
  QRectF *in_stack_fffffffffffffe20;
  QPainter *pQVar18;
  QPainter *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  QRectF *in_stack_fffffffffffffea0;
  QAlphaPaintEnginePrivate *this_01;
  QAlphaPaintEnginePrivate *local_148;
  QFlag local_118;
  undefined4 local_114;
  QRegion local_110 [40];
  QRegion local_e8 [8];
  undefined8 local_e0;
  QRegion local_d8 [8];
  undefined1 local_d0 [2] [16];
  QRegion local_b0 [8];
  undefined1 local_a8 [80];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = d_func((QAlphaPaintEngine *)0x128ef5);
  if (pQVar9->m_pic != (QPicture *)0x0) {
    QPainter::end();
    iVar4 = QPaintDevice::width((QPaintDevice *)0x128f51);
    QPaintDevice::height((QPaintDevice *)0x128f69);
    QRect::QRect(in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                 (int)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
    ;
    QRegion::intersected((QRect *)local_b0);
    QRegion::operator=(in_stack_fffffffffffffe10,
                       (QRegion *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QRegion::~QRegion(local_b0);
    iVar5 = QRegion::rectCount();
    if (10 < iVar5) {
      local_d0[0]._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_d0[0]._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_d0[0] = QRegion::boundingRect();
      QRegion::QRegion(local_d8,local_d0,0);
      QRegion::operator=(in_stack_fffffffffffffe10,
                         (QRegion *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      QRegion::~QRegion(local_d8);
    }
    local_e0 = 0xaaaaaaaaaaaaaaaa;
    pQVar10 = (QRegion *)QRegion::operator=(&pQVar9->m_cliprgn,&pQVar9->m_alphargn);
    QRegion::QRegion((QRegion *)&local_e0,pQVar10);
    pQVar9->m_pass = pQVar9->m_pass + 1;
    *(Int *)(in_RDI + 0x10) =
         (pQVar9->m_savedcaps).super_QFlagsStorageHelper<QPaintEngine::PaintEngineFeature,_4>.
         super_QFlagsStorage<QPaintEngine::PaintEngineFeature>.i;
    QPaintEngine::painter();
    QPainter::save();
    QPaintEngine::painter();
    QAlphaPaintEnginePrivate::resetState
              ((QAlphaPaintEnginePrivate *)CONCAT44(iVar4,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    memcpy(local_58,&DAT_00182080,0x50);
    QTransform::QTransform((QTransform *)in_stack_fffffffffffffe10);
    iVar5 = QPaintDevice::logicalDpiX((QPaintDevice *)0x129146);
    iVar6 = qt_defaultDpiX();
    iVar7 = QPaintDevice::logicalDpiY((QPaintDevice *)0x129189);
    iVar8 = qt_defaultDpiY();
    QTransform::scale(1.0 / ((double)iVar5 / (double)iVar6),1.0 / ((double)iVar7 / (double)iVar8));
    pQVar11 = (QTransform *)QPaintEngine::painter();
    QPainter::setTransform(pQVar11,SUB81(local_58,0));
    QPaintEngine::painter();
    QPainter::drawPicture
              ((QPainter *)in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20)
               ,(int)in_stack_fffffffffffffe18,(QPicture *)in_stack_fffffffffffffe10);
    QRegion::QRegion(local_e8);
    QRegion::operator=(in_stack_fffffffffffffe10,
                       (QRegion *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QRegion::~QRegion(local_e8);
    pQVar12 = pQVar9;
    QPaintEngine::painter();
    QAlphaPaintEnginePrivate::resetState
              ((QAlphaPaintEnginePrivate *)CONCAT44(iVar4,in_stack_fffffffffffffe80),
               (QPainter *)pQVar12);
    local_148 = (QAlphaPaintEnginePrivate *)QRegion::begin();
    pQVar12 = (QAlphaPaintEnginePrivate *)QRegion::end();
    for (; local_148 != pQVar12; local_148 = (QAlphaPaintEnginePrivate *)&local_148->field_0x10) {
      this_01 = local_148;
      QRectF::QRectF(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      QAlphaPaintEnginePrivate::drawAlphaImage(this_01,in_stack_fffffffffffffea0);
    }
    QRegion::QRegion(local_110);
    QRegion::operator=(in_stack_fffffffffffffe10,
                       (QRegion *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QRegion::~QRegion(local_110);
    QPaintEngine::painter();
    QPainter::restore();
    pQVar9->m_pass = pQVar9->m_pass + -1;
    cleanUp((QAlphaPaintEngine *)in_stack_fffffffffffffe20);
    QRegion::~QRegion((QRegion *)&local_e0);
  }
  QVar17.i = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  if ((in_SIL & 1) != 0) {
    QFlag::QFlag(&local_118,0xfffeffff);
    QFlags<QPaintEngine::PaintEngineFeature>::QFlagsStorageHelper
              ((QFlags<QPaintEngine::PaintEngineFeature> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),QVar17);
    *(undefined4 *)(in_RDI + 0x10) = local_114;
    p = (QPoint *)operator_new(0x18);
    QPicture::QPicture((QPicture *)p,-1);
    pQVar9->m_pic = (QPicture *)p;
    pQVar13 = QExplicitlySharedDataPointer<QPicturePrivate>::operator->
                        ((QExplicitlySharedDataPointer<QPicturePrivate> *)0x12943d);
    pQVar13[0x50] = (QPicturePrivate)0x1;
    this_00 = (QPainter *)operator_new(8);
    QPainter::QPainter(this_00,(QPaintDevice *)pQVar9->m_pic);
    pQVar9->m_picpainter = this_00;
    pQVar14 = (QPaintEngine *)QPainter::paintEngine();
    pQVar9->m_picengine = pQVar14;
    pQVar18 = pQVar9->m_picpainter;
    QPaintEngine::painter();
    QPainter::pen();
    QPainter::setPen((QPen *)pQVar18);
    pQVar1 = (QBrush *)pQVar9->m_picpainter;
    QPaintEngine::painter();
    QPainter::brush();
    QPainter::setBrush(pQVar1);
    QPaintEngine::painter();
    QPainter::brushOrigin();
    QPainter::setBrushOrigin(this_00,p);
    pQVar2 = (QFont *)pQVar9->m_picpainter;
    QPaintEngine::painter();
    QPainter::font();
    QPainter::setFont(pQVar2);
    QPaintEngine::painter();
    dVar16 = (double)QPainter::opacity();
    QPainter::setOpacity(dVar16);
    pQVar18 = pQVar9->m_picpainter;
    QPaintEngine::painter();
    QPainter::combinedTransform();
    QPainter::setTransform((QTransform *)pQVar18,SUB81(local_a8,0));
    QPaintEngine::syncState();
    QPainter::d_func((QPainter *)0x129638);
    pQVar15 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator*
                        ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)p);
    uVar3 = *(undefined8 *)(pQVar15 + 0x1a8);
    QPaintEngine::painter();
    QPainter::d_func((QPainter *)0x129678);
    std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator*
              ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)p);
    QPainterState::operator=
              ((QPainterState *)p,
               (QPainterState *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    *(undefined8 *)(pQVar15 + 0x1a8) = uVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAlphaPaintEngine::flushAndInit(bool init)
{
    Q_D(QAlphaPaintEngine);
    Q_ASSERT(d->m_pass == 0);

    if (d->m_pic) {
        d->m_picpainter->end();

        // set clip region
        d->m_alphargn = d->m_alphargn.intersected(QRect(0, 0, d->m_pdev->width(), d->m_pdev->height()));

        // just use the bounding rect if it's a complex region..
        if (d->m_alphargn.rectCount() > 10) {
            QRect br = d->m_alphargn.boundingRect();
            d->m_alphargn = QRegion(br);
        }

        const auto oldAlphaRegion = d->m_cliprgn = d->m_alphargn;

        // now replay the QPicture
        ++d->m_pass; // we are now doing pass #2

        // reset states
        gccaps = d->m_savedcaps;

        painter()->save();
        d->resetState(painter());

        // make sure the output from QPicture is unscaled
        QTransform mtx;
        mtx.scale(1.0f / (qreal(d->m_pdev->logicalDpiX()) / qreal(qt_defaultDpiX())),
                  1.0f / (qreal(d->m_pdev->logicalDpiY()) / qreal(qt_defaultDpiY())));
        painter()->setTransform(mtx);
        painter()->drawPicture(0, 0, *d->m_pic);

        d->m_cliprgn = QRegion();
        d->resetState(painter());

        // fill in the alpha images
        for (const auto &rect : oldAlphaRegion)
            d->drawAlphaImage(rect);

        d->m_alphargn = QRegion();

        painter()->restore();

        --d->m_pass; // pass #2 finished

        cleanUp();
    }

    if (init) {
        gccaps = PaintEngineFeatures(AllFeatures & ~QPaintEngine::ObjectBoundingModeGradients);

        d->m_pic = new QPicture();
        d->m_pic->d_ptr->in_memory_only = true;
        d->m_picpainter = new QPainter(d->m_pic);
        d->m_picengine = d->m_picpainter->paintEngine();

        // When newPage() is called and the m_picpainter is recreated
        // we have to copy the current state of the original printer
        // painter back to the m_picpainter
        d->m_picpainter->setPen(painter()->pen());
        d->m_picpainter->setBrush(painter()->brush());
        d->m_picpainter->setBrushOrigin(painter()->brushOrigin());
        d->m_picpainter->setFont(painter()->font());
        d->m_picpainter->setOpacity(painter()->opacity());
        d->m_picpainter->setTransform(painter()->combinedTransform());
        d->m_picengine->syncState();
        QPainterState &state = *d->m_picpainter->d_func()->state;
        QPainter *oldPainter = state.painter;
        state = *painter()->d_func()->state;
        state.painter = oldPainter;
    }
}